

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FStream.cxx
# Opt level: O0

BOM adios2sys::FStream::ReadBOM(istream *in)

{
  ulong uVar1;
  fpos<__mbstate_t> *in_RDI;
  unsigned_long p;
  uchar bom [4];
  unsigned_long orig;
  streamoff in_stack_ffffffffffffff68;
  fpos<__mbstate_t> *in_stack_ffffffffffffff70;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  fpos local_58 [16];
  streamoff local_48;
  undefined8 local_40;
  undefined8 local_38;
  char local_2c;
  char local_2b;
  char local_2a;
  char local_29;
  fpos local_28 [16];
  streamoff local_18;
  fpos<__mbstate_t> *local_10;
  
  local_10 = in_RDI;
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    local_28 = (fpos  [16])std::istream::tellg();
    local_18 = std::fpos::operator_cast_to_long(local_28);
    std::istream::read((char *)local_10,(long)&local_2c);
    uVar1 = std::ios::good();
    if ((uVar1 & 1) == 0) {
      std::ios::clear((int)local_10 + (int)*(undefined8 *)(local_10->_M_off + -0x18));
      std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::istream::seekg(local_10,local_40,local_38);
    }
    else {
      if ((local_2c == -0x11) && (local_2b == -0x45)) {
        std::istream::read((char *)local_10,(long)&local_2a);
        uVar1 = std::ios::good();
        if (((uVar1 & 1) != 0) && (local_2a == -0x41)) {
          return BOM_UTF8;
        }
      }
      else {
        if ((local_2c == -2) && (local_2b == -1)) {
          return BOM_UTF16BE;
        }
        if ((local_2c == '\0') && (local_2b == '\0')) {
          std::istream::read((char *)local_10,(long)&local_2a);
          uVar1 = std::ios::good();
          if ((((uVar1 & 1) != 0) && (local_2a == -2)) && (local_29 == -1)) {
            return BOM_UTF32BE;
          }
        }
        else if ((local_2c == -1) && (local_2b == -2)) {
          local_58 = (fpos  [16])std::istream::tellg();
          local_48 = std::fpos::operator_cast_to_long(local_58);
          std::istream::read((char *)local_10,(long)&local_2a);
          uVar1 = std::ios::good();
          if ((((uVar1 & 1) != 0) && (local_2a == '\0')) && (local_29 == '\0')) {
            return BOM_UTF32LE;
          }
          std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          std::istream::seekg(local_10,local_68,local_60);
          return BOM_UTF16LE;
        }
      }
      std::ios::clear((int)local_10 + (int)*(undefined8 *)(local_10->_M_off + -0x18));
      std::fpos<__mbstate_t>::fpos(local_10,in_stack_ffffffffffffff68);
      std::istream::seekg(local_10,local_78,local_70);
    }
  }
  return BOM_None;
}

Assistant:

BOM ReadBOM(std::istream& in)
{
  if (!in.good()) {
    return BOM_None;
  }
  unsigned long orig = in.tellg();
  unsigned char bom[4];
  in.read(reinterpret_cast<char*>(bom), 2);
  if (!in.good()) {
    in.clear();
    in.seekg(orig);
    return BOM_None;
  }
  if (bom[0] == 0xEF && bom[1] == 0xBB) {
    in.read(reinterpret_cast<char*>(bom + 2), 1);
    if (in.good() && bom[2] == 0xBF) {
      return BOM_UTF8;
    }
  } else if (bom[0] == 0xFE && bom[1] == 0xFF) {
    return BOM_UTF16BE;
  } else if (bom[0] == 0x00 && bom[1] == 0x00) {
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0xFE && bom[3] == 0xFF) {
      return BOM_UTF32BE;
    }
  } else if (bom[0] == 0xFF && bom[1] == 0xFE) {
    unsigned long p = in.tellg();
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0x00 && bom[3] == 0x00) {
      return BOM_UTF32LE;
    }
    in.seekg(p);
    return BOM_UTF16LE;
  }
  in.clear();
  in.seekg(orig);
  return BOM_None;
}